

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O2

VRDatumPtr __thiscall MinVR::CreateVRDatumStringArray(MinVR *this,void *pData)

{
  VRDatum_conflict *pValue;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  pValue = (VRDatum_conflict *)operator_new(0x68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_30,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pData);
  VRDatumStringArray::VRDatumStringArray((VRDatumStringArray *)pValue,&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  VRDatumPtr::VRDatumPtr((VRDatumPtr *)this,pValue);
  VVar1.reference = extraout_RDX;
  VVar1.pData = (VRDatum_conflict *)this;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumStringArray(void *pData) {
  VRDatumStringArray *obj =
    new VRDatumStringArray(*static_cast<VRStringArray *>(pData));
  return VRDatumPtr(obj);
}